

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

int8_t __thiscall
icu_63::UnicodeString::doCompareCodePointOrder
          (UnicodeString *this,int32_t start,int32_t length,UChar *srcChars,int32_t srcStart,
          int32_t srcLength)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  UChar *s2;
  char16_t *pcVar4;
  bool bVar5;
  int32_t length_local;
  int32_t start_local;
  
  bVar1 = 0xff;
  if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x1) ==
      (undefined1  [56])0x0) {
    length_local = length;
    start_local = start;
    pinIndices(this,&start_local,&length_local);
    if (((this->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
      pcVar4 = (this->fUnion).fFields.fArray;
    }
    else {
      pcVar4 = (char16_t *)((long)&this->fUnion + 2);
    }
    bVar5 = srcChars == (UChar *)0x0;
    lVar3 = (long)srcStart;
    if (bVar5) {
      srcLength = 0;
    }
    if (bVar5) {
      lVar3 = 0;
    }
    s2 = srcChars + lVar3;
    if (bVar5) {
      s2 = (UChar *)0x0;
    }
    uVar2 = uprv_strCompare_63(pcVar4 + start_local,length_local,s2,srcLength,'\0','\x01');
    bVar1 = (byte)(uVar2 >> 0xf) | 1;
    if (uVar2 == 0) {
      bVar1 = 0;
    }
  }
  return bVar1;
}

Assistant:

int8_t
UnicodeString::doCompareCodePointOrder(int32_t start,
                                       int32_t length,
                                       const UChar *srcChars,
                                       int32_t srcStart,
                                       int32_t srcLength) const
{
  // compare illegal string values
  // treat const UChar *srcChars==NULL as an empty string
  if(isBogus()) {
    return -1;
  }

  // pin indices to legal values
  pinIndices(start, length);

  if(srcChars == NULL) {
    srcStart = srcLength = 0;
  }

  int32_t diff = uprv_strCompare(getArrayStart() + start, length, (srcChars!=NULL)?(srcChars + srcStart):NULL, srcLength, FALSE, TRUE);
  /* translate the 32-bit result into an 8-bit one */
  if(diff!=0) {
    return (int8_t)(diff >> 15 | 1);
  } else {
    return 0;
  }
}